

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O1

void emtslbl(emtcxdef *ctx,uint *lblp,int release)

{
  uchar *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint local_40;
  int local_3c;
  uint *local_38;
  
  uVar6 = *lblp;
  uVar2 = ctx->emtcxofs;
  ctx->emtcxlbl[uVar6].emtlofs = uVar2;
  puVar1 = &ctx->emtcxlbl[uVar6].emtlflg;
  *puVar1 = *puVar1 | 1;
  uVar3 = ctx->emtcxlbl[uVar6].emtllnk;
  local_40 = (uint)uVar3;
  local_3c = release;
  local_38 = lblp;
  if (local_40 != 0xffff) {
    do {
      uVar4 = ctx->emtcxlbl[uVar3].emtllnk;
      uVar5 = ctx->emtcxlbl[uVar3].emtlofs;
      *(ushort *)(ctx->emtcxptr + uVar5) = uVar2 - uVar5;
      ctx->emtcxlbl[uVar3].emtllnk = 0xffff;
      emtdlbl(ctx,&local_40);
      local_40 = (uint)uVar4;
      uVar3 = uVar4;
    } while (local_40 != 0xffff);
  }
  ctx->emtcxlbl[uVar6].emtllnk = 0xffff;
  if (local_3c != 0) {
    emtdlbl(ctx,local_38);
  }
  return;
}

Assistant:

void emtslbl(emtcxdef *ctx, noreg uint *lblp, int release)
{
    uint     lbl = *lblp;
    emtldef *p = &ctx->emtcxlbl[lbl];
    uint     fwd;
    emtldef *fwdp;
    ushort   nxt;
    short    diff;
    ushort   curpos = ctx->emtcxofs;
    
    p->emtlofs = curpos;
    p->emtlflg |= EMTLFSET;
    
    /* run through forward reference list, fixing up each reference */
    for (fwd = p->emtllnk ; fwd != EMTLLNKEND ; fwd = nxt)
    {
        fwdp = &ctx->emtcxlbl[fwd];        /* get pointer to current record */
        nxt = fwdp->emtllnk;                    /* remember the next record */

        /* write the fixup, and release the forward reference */
        diff = curpos - fwdp->emtlofs;
        oswp2(ctx->emtcxptr + fwdp->emtlofs, diff);
        fwdp->emtllnk = EMTLLNKEND;
        emtdlbl(ctx, &fwd);
    }

    p->emtllnk = EMTLLNKEND;    /* there are no more forward refs for label */
    if (release) emtdlbl(ctx, lblp);
}